

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,uchar *add,size_t add_len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = ctx->add_len;
  iVar1 = -0x14;
  if (uVar2 + add_len >> 0x3d == 0 && uVar2 <= uVar2 + add_len) {
    uVar2 = uVar2 & 0xf;
    if (uVar2 != 0) {
      uVar3 = 0x10 - uVar2;
      if (add_len <= 0x10 - uVar2) {
        uVar3 = add_len;
      }
      if (uVar3 < 8) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          *(ulong *)(ctx->buf + uVar5 + uVar2 + 0x178 + -0x178) =
               *(ulong *)(ctx->buf + uVar5 + uVar2 + 0x178 + -0x178) ^ *(ulong *)(add + uVar5);
          uVar4 = uVar5 + 8;
          uVar6 = uVar5 + 0x10;
          uVar5 = uVar4;
        } while (uVar6 <= uVar3);
      }
      if (uVar4 < uVar3) {
        do {
          ctx->buf[uVar4 + uVar2 + 0x178 + -0x178] =
               ctx->buf[uVar4 + uVar2 + 0x178 + -0x178] ^ add[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar2 + uVar3 == 0x10) {
        gcm_mult(ctx,ctx->buf,ctx->buf);
      }
      ctx->add_len = ctx->add_len + uVar3;
      add_len = add_len - uVar3;
      add = add + uVar3;
    }
    ctx->add_len = ctx->add_len + add_len;
    if (0xf < add_len) {
      do {
        uVar2 = 0;
        do {
          *(ulong *)(ctx->buf + uVar2) = *(ulong *)(ctx->buf + uVar2) ^ *(ulong *)(add + uVar2);
          uVar2 = uVar2 + 8;
        } while (uVar2 < 9);
        gcm_mult(ctx,ctx->buf,ctx->buf);
        add_len = add_len - 0x10;
        add = add + 0x10;
      } while (0xf < add_len);
    }
    iVar1 = 0;
    if (add_len != 0) {
      if (add_len < 8) {
        uVar3 = 0;
      }
      else {
        uVar2 = 0;
        do {
          *(ulong *)(ctx->buf + uVar2) = *(ulong *)(ctx->buf + uVar2) ^ *(ulong *)(add + uVar2);
          uVar3 = uVar2 + 8;
          uVar5 = uVar2 + 0x10;
          uVar2 = uVar3;
        } while (uVar5 <= add_len);
      }
      iVar1 = 0;
      if (uVar3 < add_len) {
        do {
          ctx->buf[uVar3] = ctx->buf[uVar3] ^ add[uVar3];
          uVar3 = uVar3 + 1;
          iVar1 = 0;
        } while (add_len != uVar3);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,
                          const unsigned char *add, size_t add_len)
{
    const unsigned char *p;
    size_t use_len, offset;
    uint64_t new_add_len;

    /* AD is limited to 2^64 bits, ie 2^61 bytes
     * Also check for possible overflow */
#if SIZE_MAX > 0xFFFFFFFFFFFFFFFFULL
    if (add_len > 0xFFFFFFFFFFFFFFFFULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }
#endif
    new_add_len = ctx->add_len + (uint64_t) add_len;
    if (new_add_len < ctx->add_len || new_add_len >> 61 != 0) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    offset = ctx->add_len % 16;
    p = add;

    if (offset != 0) {
        use_len = 16 - offset;
        if (use_len > add_len) {
            use_len = add_len;
        }

        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, p, use_len);

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->add_len += use_len;
        add_len -= use_len;
        p += use_len;
    }

    ctx->add_len += add_len;

    while (add_len >= 16) {
        mbedtls_xor(ctx->buf, ctx->buf, p, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        add_len -= 16;
        p += 16;
    }

    if (add_len > 0) {
        mbedtls_xor(ctx->buf, ctx->buf, p, add_len);
    }

    return 0;
}